

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_a2c9b3::ResolveObjectPlacement
               (aiMatrix4x4 *m,IfcObjectPlacement *place,ConversionData *conv)

{
  bool bVar1;
  element_type *in;
  Lazy *this;
  IfcObjectPlacement *place_00;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  format local_2e0;
  aiMatrix4x4t<float> local_168;
  undefined1 local_128 [8];
  aiMatrix4x4 tmp_1;
  undefined1 local_a8 [8];
  IfcMatrix4 tmp;
  IfcLocalPlacement *local;
  ConversionData *conv_local;
  IfcObjectPlacement *place_local;
  aiMatrix4x4 *m_local;
  
  tmp.d4 = (double)Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcLocalPlacement>
                             ((Object *)
                              ((long)&(place->
                                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>
                                      )._vptr_ObjectHelper +
                              (long)(place->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>
                                    )._vptr_ObjectHelper[-3]));
  if ((IfcLocalPlacement *)tmp.d4 == (IfcLocalPlacement *)0x0) {
    Assimp::STEP::Object::GetClassName_abi_cxx11_
              (&local_320,
               (Object *)
               ((long)&(place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>)
                       ._vptr_ObjectHelper +
               (long)(place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                     _vptr_ObjectHelper[-3]));
    std::operator+(&local_300,"skipping unknown IfcObjectPlacement entity, type is ",&local_320);
    Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_2e0,
               &local_300);
    Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn(&local_2e0);
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
  }
  else {
    aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_a8);
    in = std::
         __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)((long)tmp.d4 + 0x30));
    Assimp::IFC::ConvertAxisPlacement((IfcMatrix4 *)local_a8,in,conv);
    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
              ((aiMatrix4x4t<float> *)&tmp_1.d3,(aiMatrix4x4t *)local_a8);
    memcpy(m,&tmp_1.d3,0x40);
    bVar1 = Assimp::STEP::Maybe::operator_cast_to_bool((Maybe *)((long)tmp.d4 + 0x20));
    if (bVar1) {
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_128);
      this = (Lazy *)Assimp::STEP::
                     Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>::Get
                               ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
                                 *)((long)tmp.d4 + 0x20));
      place_00 = Assimp::STEP::Lazy::operator_cast_to_IfcObjectPlacement_(this);
      ResolveObjectPlacement((aiMatrix4x4 *)local_128,place_00,conv);
      aiMatrix4x4t<float>::operator*(&local_168,(aiMatrix4x4t<float> *)local_128,m);
      memcpy(m,&local_168,0x40);
    }
  }
  return;
}

Assistant:

void ResolveObjectPlacement(aiMatrix4x4& m, const Schema_2x3::IfcObjectPlacement& place, ConversionData& conv)
{
    if (const Schema_2x3::IfcLocalPlacement* const local = place.ToPtr<Schema_2x3::IfcLocalPlacement>()){
        IfcMatrix4 tmp;
        ConvertAxisPlacement(tmp, *local->RelativePlacement, conv);

        m = static_cast<aiMatrix4x4>(tmp);

        if (local->PlacementRelTo) {
            aiMatrix4x4 tmp;
            ResolveObjectPlacement(tmp,local->PlacementRelTo.Get(),conv);
            m = tmp * m;
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcObjectPlacement entity, type is " + place.GetClassName());
    }
}